

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_buf.c
# Opt level: O1

void * uo_buf_memcpy_append(uo_buf *buf,void *src,size_t size)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  
  plVar1 = (long *)*buf;
  lVar2 = plVar1[-2];
  lVar3 = plVar1[-1];
  if (lVar2 - lVar3 <= (long)size) {
    plVar1 = plVar1 + -2;
    do {
      lVar3 = lVar2 * 2;
      lVar2 = lVar2 * 2;
      plVar1 = (long *)realloc(plVar1,lVar3 + 0x10);
      *plVar1 = lVar2;
      lVar3 = plVar1[1];
    } while (lVar2 - lVar3 <= (long)size);
    plVar1 = plVar1 + 2;
    *buf = (uo_buf)plVar1;
  }
  memcpy((void *)(lVar3 + (long)plVar1),src,size);
  plVar1[-1] = plVar1[-1] + size;
  return (void *)(lVar3 + (long)plVar1);
}

Assistant:

void *uo_buf_memcpy_append(
    uo_buf *restrict buf,
    const void *restrict src, 
    size_t size)
{
    while (uo_buf_get_len_after_ptr(*buf) <= (ptrdiff_t)size)
        *buf = uo_buf_realloc_2x(*buf);

    void *dst = memcpy(uo_buf_get_ptr(*buf), src, size);

    uo_buf_set_ptr_rel(*buf, size);

    return dst;
}